

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionPdu.cpp
# Opt level: O1

void __thiscall DIS::CollisionPdu::CollisionPdu(CollisionPdu *this)

{
  EntityInformationFamilyPdu::EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  (this->super_EntityInformationFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__CollisionPdu_0019f740;
  EntityID::EntityID(&this->_issuingEntityID);
  EntityID::EntityID(&this->_collidingEntityID);
  EventID::EventID(&this->_eventID);
  this->_collisionType = '\0';
  this->_pad = '\0';
  Vector3Float::Vector3Float(&this->_velocity);
  this->_mass = 0.0;
  Vector3Float::Vector3Float(&this->_location);
  Pdu::setPduType((Pdu *)this,'\x04');
  Pdu::setProtocolFamily((Pdu *)this,'\x01');
  return;
}

Assistant:

CollisionPdu::CollisionPdu() : EntityInformationFamilyPdu(),
   _issuingEntityID(), 
   _collidingEntityID(), 
   _eventID(), 
   _collisionType(0), 
   _pad(0), 
   _velocity(), 
   _mass(0.0), 
   _location()
{
    setPduType( 4 );
    setProtocolFamily( 1 );
}